

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O0

bool __thiscall fmcalc::init_itemtotiv(fmcalc *this)

{
  value_type vVar1;
  float fVar2;
  FILE *__stream;
  int iVar3;
  bool bVar4;
  long lVar5;
  char *__filename;
  FILE *__stream_00;
  undefined8 uVar6;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  ulong uVar10;
  reference this_00;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference piVar14;
  _Self local_140;
  _Self local_138;
  iterator k;
  int j;
  int i_2;
  int local_f8;
  int local_f4;
  int i_1;
  int final_level;
  size_t i;
  int local_e0;
  item itm;
  int local_c4;
  uint nrec;
  int last_item_id;
  longlong sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [39];
  allocator local_71;
  string local_70 [8];
  string file;
  FILE *fin;
  undefined1 local_30 [7];
  bool has_coverage;
  vector<float,_std::allocator<float>_> coverages;
  fmcalc *this_local;
  
  coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  bVar4 = loadcoverages(this,(vector<float,_std::allocator<float>_> *)local_30);
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"input/items.bin",&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    lVar5 = std::__cxx11::string::length();
    if (lVar5 != 0) {
      std::__cxx11::string::substr((ulong)&sz,(ulong)local_70);
      std::operator+(local_98,&this->inputpath_);
      std::__cxx11::string::operator=(local_70,(string *)local_98);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)&sz);
    }
    __filename = (char *)std::__cxx11::string::c_str();
    __stream_00 = fopen(__filename,"rb");
    __stream = _stderr;
    if (__stream_00 == (FILE *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      fprintf(__stream,"FATAL: %s: cannot open %s\n","init_itemtotiv",uVar6);
      exit(1);
    }
    fseek(__stream_00,0,2);
    lVar5 = ftell(__stream_00);
    fseek(__stream_00,0,0);
    local_c4 = 0;
    nrec = (uint)lVar5;
    itm.group_id = 0;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->item_to_tiv_,(ulong)(nrec / 0x14 + 1),(value_type_conflict1 *)&itm.group_id);
    itm.vulnerability_id = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->item_to_cov_id_,(ulong)(nrec / 0x14 + 1),&itm.vulnerability_id);
    _i_1 = fread((void *)((long)&i + 4),0x14,1,__stream_00);
    while (_i_1 != 0) {
      if (i._4_4_ != local_c4 + 1) {
        fprintf(_stderr,"FATAL: Item ids are not contiguous or do not start from one");
        exit(-1);
      }
      local_c4 = i._4_4_;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_30,(long)local_e0);
      vVar1 = *pvVar7;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->item_to_tiv_,(long)i._4_4_);
      iVar3 = local_e0;
      *pvVar7 = vVar1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->item_to_cov_id_,(long)i._4_4_);
      *pvVar8 = iVar3;
      _i_1 = fread((void *)((long)&i + 4),0x14,1,__stream_00);
    }
    fclose(__stream_00);
    sVar9 = std::
            vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            ::size(&this->node_to_direct_sub_nodes_vec_);
    local_f4 = (int)sVar9 + -1;
    local_f8 = 1;
    while( true ) {
      uVar10 = (ulong)local_f8;
      this_00 = std::
                vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                ::operator[](&this->node_to_direct_sub_nodes_vec_,(long)local_f4);
      sVar9 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(this_00);
      if (sVar9 <= uVar10) break;
      assign_coverage_ids((set<int,_std::less<int>,_std::allocator<int>_> *)&j,this,local_f4,
                          local_f8);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&j);
      local_f8 = local_f8 + 1;
    }
    sVar9 = std::
            vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
            ::size(&this->node_to_coverage_ids_);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->accumulated_tivs_,sVar9);
    k._M_node._4_4_ = 0;
    while( true ) {
      uVar10 = (ulong)k._M_node._4_4_;
      sVar9 = std::
              vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ::size(&this->node_to_coverage_ids_);
      if (sVar9 <= uVar10) break;
      pvVar11 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::operator[](&this->accumulated_tivs_,(long)k._M_node._4_4_);
      pvVar12 = std::
                vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                ::operator[](&this->node_to_coverage_ids_,(long)k._M_node._4_4_);
      sVar9 = std::
              vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::size(pvVar12);
      std::vector<float,_std::allocator<float>_>::resize(pvVar11,sVar9);
      k._M_node._0_4_ = 0;
      while( true ) {
        uVar10 = (ulong)(int)k._M_node;
        pvVar12 = std::
                  vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                  ::operator[](&this->node_to_coverage_ids_,(long)k._M_node._4_4_);
        sVar9 = std::
                vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ::size(pvVar12);
        if (sVar9 <= uVar10) break;
        pvVar11 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[](&this->accumulated_tivs_,(long)k._M_node._4_4_);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           (pvVar11,(long)(int)k._M_node);
        *pvVar7 = 0.0;
        pvVar12 = std::
                  vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                  ::operator[](&this->node_to_coverage_ids_,(long)k._M_node._4_4_);
        pvVar13 = std::
                  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ::operator[](pvVar12,(long)(int)k._M_node);
        local_138._M_node =
             (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pvVar13);
        while( true ) {
          pvVar12 = std::
                    vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                    ::operator[](&this->node_to_coverage_ids_,(long)k._M_node._4_4_);
          pvVar13 = std::
                    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ::operator[](pvVar12,(long)(int)k._M_node);
          local_140._M_node =
               (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(pvVar13);
          bVar4 = std::operator!=(&local_138,&local_140);
          if (!bVar4) break;
          piVar14 = std::_Rb_tree_const_iterator<int>::operator*(&local_138);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_30,(long)*piVar14);
          fVar2 = *pvVar7;
          pvVar11 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](&this->accumulated_tivs_,(long)k._M_node._4_4_);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             (pvVar11,(long)(int)k._M_node);
          *pvVar7 = fVar2 + *pvVar7;
          std::_Rb_tree_const_iterator<int>::operator++(&local_138,0);
        }
        k._M_node._0_4_ = (int)k._M_node + 1;
      }
      k._M_node._4_4_ = k._M_node._4_4_ + 1;
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string(local_70);
  }
  else {
    this_local._7_1_ = false;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool fmcalc::init_itemtotiv()
{
	std::vector<OASIS_FLOAT> coverages;
	bool has_coverage = loadcoverages(coverages);
	if (!has_coverage) return false;

	FILE *fin = NULL;
	std::string file = ITEMS_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);
	int last_item_id = 0;

	unsigned int nrec = (unsigned int)sz / (unsigned int)sizeof(item);
	item_to_tiv_.resize(nrec + 1, 0.0);
	item_to_cov_id_.resize(nrec + 1, 0);

	item itm;
	size_t i = fread(&itm, sizeof(itm), 1, fin);
	while (i != 0) {
		last_item_id++;
		if (itm.id != last_item_id) {
			fprintf(stderr, "FATAL: Item ids are not contiguous or do not start from one");
			exit(-1);
		}
		last_item_id = itm.id;
        item_to_tiv_[itm.id] = coverages[itm.coverage_id];
        item_to_cov_id_[itm.id] = itm.coverage_id;
		i = fread(&itm, sizeof(itm), 1, fin);
	}
	fclose(fin);

	// Calculate accumulated TIV
	int final_level = node_to_direct_sub_nodes_vec_.size() - 1;
	for (int i = 1; i < node_to_direct_sub_nodes_vec_[final_level].size(); i++) {
		assign_coverage_ids(final_level, i);
	}
	accumulated_tivs_.resize(node_to_coverage_ids_.size());
	for (int i = 0; i < node_to_coverage_ids_.size(); i++) {
		accumulated_tivs_[i].resize(node_to_coverage_ids_[i].size());
		for (int j = 0; j < node_to_coverage_ids_[i].size(); j++) {
			accumulated_tivs_[i][j] = 0;
			for (std::set<int>::iterator k = node_to_coverage_ids_[i][j].begin();
					k != node_to_coverage_ids_[i][j].end(); k++) {
				accumulated_tivs_[i][j] += coverages[*k];
			}
		}
	}
	return true;

}